

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_init_layer_context(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  LAYER_CONTEXT *pLVar4;
  int iVar5;
  int iVar6;
  int8_t *piVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int local_48;
  
  iVar1 = (cpi->common).mi_params.mi_rows;
  iVar2 = (cpi->common).mi_params.mi_cols;
  (cpi->svc).base_framerate = 30.0;
  (cpi->svc).current_superframe = 0;
  (cpi->svc).force_zero_mode_spatial_ref = 1;
  (cpi->svc).has_lower_quality_layer = 0;
  (cpi->svc).num_encoded_top_layer = 0;
  (cpi->svc).use_flexible_mode = 0;
  for (lVar8 = 0; iVar10 = (cpi->svc).number_spatial_layers, lVar8 < iVar10; lVar8 = lVar8 + 1) {
    for (iVar10 = 0; iVar3 = (cpi->svc).number_temporal_layers, iVar10 < iVar3; iVar10 = iVar10 + 1)
    {
      local_48 = (int)lVar8;
      iVar5 = iVar3 * local_48 + iVar10;
      pLVar4 = (cpi->svc).layer_context;
      pLVar4[iVar5].rc.ni_av_qi = (cpi->oxcf).rc_cfg.worst_allowed_q;
      pLVar4[iVar5].p_rc.total_actual_bits = 0;
      pLVar4[iVar5].rc.ni_tot_qi = 0;
      pLVar4[iVar5].p_rc.tot_q = 0.0;
      pLVar4[iVar5].p_rc.avg_q = 0.0;
      pLVar4[iVar5].p_rc.ni_frames = 0;
      pLVar4[iVar5].rc.decimation_factor = 0;
      pLVar4[iVar5].rc.decimation_count = 0;
      iVar6 = av1_quantizer_to_qindex(pLVar4[iVar5].max_q);
      pLVar4[iVar5].rc.worst_quality = iVar6;
      iVar6 = av1_quantizer_to_qindex(pLVar4[iVar5].min_q);
      pLVar4[iVar5].rc.best_quality = iVar6;
      pLVar4[iVar5].rc.rtc_external_ratectrl = 0;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        pLVar4[iVar3 * local_48 + iVar10].p_rc.rate_correction_factors[lVar9] = 1.0;
      }
      lVar9 = pLVar4[iVar5].layer_target_bitrate;
      pLVar4[iVar5].target_bandwidth = lVar9;
      iVar3 = pLVar4[iVar5].rc.worst_quality;
      pLVar4[iVar5].p_rc.last_q[1] = iVar3;
      pLVar4[iVar5].p_rc.avg_frame_qindex[1] = iVar3;
      pLVar4[iVar5].p_rc.avg_frame_qindex[0] = iVar3;
      lVar9 = (lVar9 * (cpi->oxcf).rc_cfg.starting_buffer_level_ms) / 1000;
      pLVar4[iVar5].p_rc.buffer_level = lVar9;
      pLVar4[iVar5].p_rc.bits_off_target = lVar9;
      if ((iVar10 == 0) && (1 < (cpi->svc).number_spatial_layers)) {
        pLVar4[iVar5].sb_index = 0;
        pLVar4[iVar5].actual_num_seg1_blocks = 0;
        pLVar4[iVar5].actual_num_seg2_blocks = 0;
        pLVar4[iVar5].counter_encode_maxq_scene_change = 0;
        aom_free(pLVar4[iVar5].map);
        piVar7 = (int8_t *)aom_calloc((long)iVar2 * (long)iVar1,1);
        pLVar4[iVar5].map = piVar7;
        if (piVar7 == (int8_t *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate lc->map");
        }
      }
    }
    (cpi->svc).downsample_filter_type[lVar8] = BILINEAR;
    (cpi->svc).downsample_filter_phase[lVar8] = 8;
    (cpi->svc).last_layer_dropped[lVar8] = false;
    (cpi->svc).drop_spatial_layer[lVar8] = false;
  }
  if (iVar10 == 3) {
    (cpi->svc).downsample_filter_type[0] = EIGHTTAP_SMOOTH;
  }
  return;
}

Assistant:

void av1_init_layer_context(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  SVC *const svc = &cpi->svc;
  int mi_rows = cpi->common.mi_params.mi_rows;
  int mi_cols = cpi->common.mi_params.mi_cols;
  svc->base_framerate = 30.0;
  svc->current_superframe = 0;
  svc->force_zero_mode_spatial_ref = 1;
  svc->num_encoded_top_layer = 0;
  svc->use_flexible_mode = 0;
  svc->has_lower_quality_layer = 0;

  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lrc->ni_av_qi = oxcf->rc_cfg.worst_allowed_q;
      lp_rc->total_actual_bits = 0;
      lrc->ni_tot_qi = 0;
      lp_rc->tot_q = 0.0;
      lp_rc->avg_q = 0.0;
      lp_rc->ni_frames = 0;
      lrc->decimation_count = 0;
      lrc->decimation_factor = 0;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      lrc->rtc_external_ratectrl = 0;
      for (int i = 0; i < RATE_FACTOR_LEVELS; ++i) {
        lp_rc->rate_correction_factors[i] = 1.0;
      }
      lc->target_bandwidth = lc->layer_target_bitrate;
      lp_rc->last_q[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[KEY_FRAME] = lrc->worst_quality;
      lp_rc->buffer_level =
          oxcf->rc_cfg.starting_buffer_level_ms * lc->target_bandwidth / 1000;
      lp_rc->bits_off_target = lp_rc->buffer_level;
      // Initialize the cyclic refresh parameters. If spatial layers are used
      // (i.e., ss_number_layers > 1), these need to be updated per spatial
      // layer. Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
    svc->downsample_filter_type[sl] = BILINEAR;
    svc->downsample_filter_phase[sl] = 8;
    svc->last_layer_dropped[sl] = false;
    svc->drop_spatial_layer[sl] = false;
  }
  if (svc->number_spatial_layers == 3) {
    svc->downsample_filter_type[0] = EIGHTTAP_SMOOTH;
  }
}